

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

UBool icu_63::isEquivalentDateRule
                (int32_t month,int32_t weekInMonth,int32_t dayOfWeek,DateTimeRule *dtrule)

{
  int32_t iVar1;
  TimeRuleType TVar2;
  DateRuleType DVar3;
  uint uVar4;
  int iVar5;
  
  iVar1 = DateTimeRule::getRuleMonth(dtrule);
  if (((iVar1 == month) && (iVar1 = DateTimeRule::getRuleDayOfWeek(dtrule), iVar1 == dayOfWeek)) &&
     (TVar2 = DateTimeRule::getTimeRuleType(dtrule), TVar2 == WALL_TIME)) {
    DVar3 = DateTimeRule::getDateRuleType(dtrule);
    if ((DVar3 == DOW) && (iVar1 = DateTimeRule::getRuleWeekInMonth(dtrule), iVar1 == weekInMonth))
    {
      return '\x01';
    }
    iVar1 = DateTimeRule::getRuleDayOfMonth(dtrule);
    DVar3 = DateTimeRule::getDateRuleType(dtrule);
    if (DVar3 == DOW_GEQ_DOM) {
      if ((iVar1 % 7 == 1) &&
         (iVar5 = (int)((ulong)((long)(iVar1 + 6) * -0x6db6db6d) >> 0x20) + iVar1 + 6,
         (iVar5 >> 2) - (iVar5 >> 0x1f) == weekInMonth)) {
        return '\x01';
      }
      if (((month != 1) &&
          (uVar4 = *(int *)(MONTHLENGTH + (long)month * 4) - iVar1, (int)uVar4 % 7 == 6)) &&
         (iVar5 = (int)((ulong)((long)(int)(uVar4 + 1) * 0x6db6db6d) >> 0x20) + ~uVar4,
         (iVar5 >> 2) - (iVar5 >> 0x1f) == weekInMonth)) {
        return '\x01';
      }
    }
    DVar3 = DateTimeRule::getDateRuleType(dtrule);
    if (DVar3 == DOW_LEQ_DOM) {
      if ((iVar1 * -0x49249249 + 0x12492492U < 0x24924925) && (iVar1 / 7 == weekInMonth)) {
        return '\x01';
      }
      if (((month != 1) &&
          (iVar5 = *(int *)(MONTHLENGTH + (long)month * 4) - iVar1,
          iVar5 * -0x49249249 + 0x12492492U < 0x24924925)) &&
         (iVar5 = (int)((ulong)((long)iVar5 * 0x6db6db6d) >> 0x20) - iVar5,
         ((iVar5 >> 2) - (iVar5 >> 0x1f)) + -1 == weekInMonth)) {
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

static UBool isEquivalentDateRule(int32_t month, int32_t weekInMonth, int32_t dayOfWeek, const DateTimeRule *dtrule) {
    if (month != dtrule->getRuleMonth() || dayOfWeek != dtrule->getRuleDayOfWeek()) {
        return FALSE;
    }
    if (dtrule->getTimeRuleType() != DateTimeRule::WALL_TIME) {
        // Do not try to do more intelligent comparison for now.
        return FALSE;
    }
    if (dtrule->getDateRuleType() == DateTimeRule::DOW
            && dtrule->getRuleWeekInMonth() == weekInMonth) {
        return TRUE;
    }
    int32_t ruleDOM = dtrule->getRuleDayOfMonth();
    if (dtrule->getDateRuleType() == DateTimeRule::DOW_GEQ_DOM) {
        if (ruleDOM%7 == 1 && (ruleDOM + 6)/7 == weekInMonth) {
            return TRUE;
        }
        if (month != UCAL_FEBRUARY && (MONTHLENGTH[month] - ruleDOM)%7 == 6
                && weekInMonth == -1*((MONTHLENGTH[month]-ruleDOM+1)/7)) {
            return TRUE;
        }
    }
    if (dtrule->getDateRuleType() == DateTimeRule::DOW_LEQ_DOM) {
        if (ruleDOM%7 == 0 && ruleDOM/7 == weekInMonth) {
            return TRUE;
        }
        if (month != UCAL_FEBRUARY && (MONTHLENGTH[month] - ruleDOM)%7 == 0
                && weekInMonth == -1*((MONTHLENGTH[month] - ruleDOM)/7 + 1)) {
            return TRUE;
        }
    }
    return FALSE;
}